

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O0

void VP8IteratorInit(VP8Encoder *enc,VP8EncIterator *it)

{
  VP8EncIterator *in_RSI;
  VP8Encoder *in_RDI;
  
  in_RSI->enc = in_RDI;
  in_RSI->yuv_in = (uint8_t *)((ulong)(in_RSI->yuv_mem + 0x1f) & 0xffffffffffffffe0);
  in_RSI->yuv_out = in_RSI->yuv_in + 0x200;
  in_RSI->yuv_out2 = in_RSI->yuv_out + 0x200;
  in_RSI->yuv_p = in_RSI->yuv_out2 + 0x200;
  in_RSI->lf_stats = in_RDI->lf_stats;
  in_RSI->percent0 = in_RDI->percent;
  in_RSI->y_left = (uint8_t *)((ulong)(in_RSI->yuv_left_mem + 0x20) & 0xffffffffffffffe0);
  in_RSI->u_left = in_RSI->y_left + 0x20;
  in_RSI->v_left = in_RSI->u_left + 0x10;
  in_RSI->top_derr = in_RDI->top_derr;
  VP8IteratorReset(in_RSI);
  return;
}

Assistant:

void VP8IteratorInit(VP8Encoder* const enc, VP8EncIterator* const it) {
  it->enc = enc;
  it->yuv_in   = (uint8_t*)WEBP_ALIGN(it->yuv_mem);
  it->yuv_out  = it->yuv_in + YUV_SIZE_ENC;
  it->yuv_out2 = it->yuv_out + YUV_SIZE_ENC;
  it->yuv_p    = it->yuv_out2 + YUV_SIZE_ENC;
  it->lf_stats = enc->lf_stats;
  it->percent0 = enc->percent;
  it->y_left = (uint8_t*)WEBP_ALIGN(it->yuv_left_mem + 1);
  it->u_left = it->y_left + 16 + 16;
  it->v_left = it->u_left + 16;
  it->top_derr = enc->top_derr;
  VP8IteratorReset(it);
}